

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseCFG.h
# Opt level: O0

CFG * covenant::parse_cfg<covenant::StrParse,boost::shared_ptr<covenant::TerminalFactory>>
                (StrParse *input,shared_ptr<covenant::TerminalFactory> *tfac)

{
  bool bVar1;
  char cVar2;
  string *msg;
  CFG *in_RDX;
  CFG *in_RDI;
  NonTerminalMap mapping;
  CFG *g;
  shared_ptr<covenant::TerminalFactory> *in_stack_ffffffffffffff28;
  CFG *in_stack_ffffffffffffff30;
  allocator *this;
  undefined7 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3f;
  CFG *this_00;
  allocator local_99;
  string local_98 [36];
  undefined4 local_74;
  byte local_19;
  
  local_19 = 0;
  this_00 = in_RDI;
  boost::shared_ptr<covenant::TerminalFactory>::shared_ptr
            ((shared_ptr<covenant::TerminalFactory> *)in_stack_ffffffffffffff30,
             in_stack_ffffffffffffff28);
  CFG::CFG(in_RDX,(TermFactory *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
  boost::shared_ptr<covenant::TerminalFactory>::~shared_ptr
            ((shared_ptr<covenant::TerminalFactory> *)0x1e9c61);
  boost::unordered::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_covenant::Sym,_boost::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_covenant::Sym>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_covenant::Sym,_boost::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_covenant::Sym>_>_>
                   *)this_00);
  parse_rules<covenant::StrParse>
            ((StrParse *)in_RDX,(CFG *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38)
             ,(NonTerminalMap *)in_stack_ffffffffffffff30);
  bVar1 = StrParse::empty((StrParse *)in_stack_ffffffffffffff30);
  if (!bVar1) {
    consume_blanks<covenant::StrParse>((StrParse *)in_stack_ffffffffffffff30);
    bVar1 = StrParse::empty((StrParse *)in_stack_ffffffffffffff30);
    if ((!bVar1) && (cVar2 = StrParse::peek((StrParse *)in_stack_ffffffffffffff30), cVar2 != ')')) {
      msg = (string *)__cxa_allocate_exception(0x20);
      this = &local_99;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_98,"during the parsing of the cfg",this);
      error::error((error *)this,msg);
      __cxa_throw(msg,&error::typeinfo,error::~error);
    }
  }
  local_19 = 1;
  local_74 = 1;
  boost::unordered::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_covenant::Sym,_boost::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_covenant::Sym>_>_>
  ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_covenant::Sym,_boost::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_covenant::Sym>_>_>
                    *)0x1e9e21);
  if ((local_19 & 1) == 0) {
    CFG::~CFG(in_stack_ffffffffffffff30);
  }
  return in_RDI;
}

Assistant:

CFG parse_cfg(In& input, TerminalFactory tfac)
{
  CFG g(tfac);

  NonTerminalMap mapping;
  parse_rules(input, g, mapping);
  if(input.empty()) return g;
  consume_blanks(input);
  // the special case if input.peek() == ')' is in case we read the
  // format (elem (##VARS##) (##CFL##))
  if (input.empty() || input.peek() == ')') 
    return g;
  
  throw error("during the parsing of the cfg");
}